

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallTargetGenerator::AddRanlibRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  bool bVar1;
  TargetType TVar2;
  cmMakefile *this_00;
  string *psVar3;
  ostream *poVar4;
  string local_50;
  
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if ((TVar2 == STATIC_LIBRARY) && (bVar1 = cmGeneratorTarget::IsApple(this->Target), bVar1)) {
    this_00 = cmTarget::GetMakefile(this->Target->Target);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_RANLIB","");
    psVar3 = cmMakefile::GetRequiredDefinition(this_00,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (psVar3->_M_string_length != 0) {
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          indent.Level = indent.Level + -1;
        } while (indent.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"execute_process(COMMAND \"",0x19);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" \"",3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(toDestDirPath->_M_dataplus)._M_p,toDestDirPath->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\")\n",3);
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddRanlibRule(std::ostream& os, Indent indent,
                                             const std::string& toDestDirPath)
{
  // Static libraries need ranlib on this platform.
  if (this->Target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    return;
  }

  // Perform post-installation processing on the file depending
  // on its type.
  if (!this->Target->IsApple()) {
    return;
  }

  const std::string& ranlib =
    this->Target->Target->GetMakefile()->GetRequiredDefinition("CMAKE_RANLIB");
  if (ranlib.empty()) {
    return;
  }

  os << indent << "execute_process(COMMAND \"" << ranlib << "\" \""
     << toDestDirPath << "\")\n";
}